

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void __thiscall deqp::gls::FboUtil::ValidStatusCodes::logRules(ValidStatusCodes *this,TestLog *log)

{
  pointer pcVar1;
  char *pcVar2;
  pointer pRVar3;
  long lVar4;
  ValidStatusCodes *pVVar5;
  ValidStatusCodes *this_00;
  long lVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defaultRule;
  ScopedLogSection section;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  pointer local_48;
  pointer local_40;
  ScopedLogSection local_38;
  
  this_00 = (ValidStatusCodes *)local_88;
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Rules","");
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Active rules","");
  tcu::ScopedLogSection::ScopedLogSection(&local_38,log,(string *)local_68,(string *)local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  pRVar3 = (this->m_errorCodes).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_errorCodes).
                              super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3) *
          -0x49249249) {
    lVar6 = 8;
    lVar4 = 0;
    do {
      pcVar2 = glu::getErrorName(*(int *)((long)pRVar3 + lVar6 + -8));
      pVVar5 = (ValidStatusCodes *)local_68;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,pcVar2,(allocator<char> *)local_88);
      logRule(pVVar5,log,(string *)local_68,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&((this->m_errorCodes).
                          super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                          ._M_impl.super__Vector_impl_data._M_start)->errorCode + lVar6));
      if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      lVar4 = lVar4 + 1;
      pRVar3 = (this->m_errorCodes).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x38;
    } while (lVar4 < (int)((ulong)((long)(this->m_errorCodes).
                                         super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3)
                          >> 3) * -0x49249249);
  }
  pRVar3 = (this->m_errorStatuses).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_errorStatuses).
                              super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3) *
          -0x49249249) {
    lVar6 = 8;
    lVar4 = 0;
    do {
      pcVar2 = glu::getFramebufferStatusName(*(int *)((long)pRVar3 + lVar6 + -8));
      pVVar5 = (ValidStatusCodes *)local_68;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,pcVar2,(allocator<char> *)local_88);
      logRule(pVVar5,log,(string *)local_68,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&((this->m_errorStatuses).
                          super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                          ._M_impl.super__Vector_impl_data._M_start)->errorCode + lVar6));
      if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      lVar4 = lVar4 + 1;
      pRVar3 = (this->m_errorStatuses).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x38;
    } while (lVar4 < (int)((ulong)((long)(this->m_errorStatuses).
                                         super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3)
                          >> 3) * -0x49249249);
  }
  if (this->m_allowComplete != false) {
    local_68._24_8_ = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_68._16_8_ = 0;
    local_40 = (pointer)0x0;
    pcVar1 = local_88 + 0x10;
    local_88._0_8_ = pcVar1;
    local_48 = (pointer)local_68._24_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"FBO is complete","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    local_88._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"GL_FRAMEBUFFER_COMPLETE","")
    ;
    logRule(this_00,log,(string *)local_88,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
  }
  tcu::TestLog::endSection(local_38.m_log);
  return;
}

Assistant:

void ValidStatusCodes::logRules (tcu::TestLog& log) const
{
	const tcu::ScopedLogSection section(log, "Rules", "Active rules");

	for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		logRule(log, glu::getErrorName(m_errorCodes[ndx].errorCode), m_errorCodes[ndx].rules);

	for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		logRule(log, glu::getFramebufferStatusName(m_errorStatuses[ndx].errorCode), m_errorStatuses[ndx].rules);

	if (m_allowComplete)
	{
		std::set<std::string> defaultRule;
		defaultRule.insert("FBO is complete");
		logRule(log, "GL_FRAMEBUFFER_COMPLETE", defaultRule);
	}
}